

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# COLLADASaxFWLSidTreeNode.cpp
# Opt level: O3

SidTreeNode * __thiscall
COLLADASaxFWL::SidTreeNode::createAndAddChild(SidTreeNode *this,String *sid)

{
  pointer *pppSVar1;
  iterator __position;
  SidTreeNode *this_00;
  SidTreeNode *newChild;
  SidIdentifier newIdentifier;
  SidTreeNode *local_50;
  SidIdentifier local_48;
  pair<COLLADASaxFWL::SidTreeNode::SidIdentifier,_COLLADASaxFWL::SidTreeNode_*> local_38;
  
  this_00 = (SidTreeNode *)operator_new(0x88);
  SidTreeNode(this_00,sid,this);
  __position._M_current =
       (this->mDirectChildren).
       super__Vector_base<COLLADASaxFWL::SidTreeNode_*,_std::allocator<COLLADASaxFWL::SidTreeNode_*>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_50 = this_00;
  if (__position._M_current ==
      (this->mDirectChildren).
      super__Vector_base<COLLADASaxFWL::SidTreeNode_*,_std::allocator<COLLADASaxFWL::SidTreeNode_*>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::vector<COLLADASaxFWL::SidTreeNode*,std::allocator<COLLADASaxFWL::SidTreeNode*>>::
    _M_realloc_insert<COLLADASaxFWL::SidTreeNode*const&>
              ((vector<COLLADASaxFWL::SidTreeNode*,std::allocator<COLLADASaxFWL::SidTreeNode*>> *)
               &this->mDirectChildren,__position,&local_50);
  }
  else {
    *__position._M_current = this_00;
    pppSVar1 = &(this->mDirectChildren).
                super__Vector_base<COLLADASaxFWL::SidTreeNode_*,_std::allocator<COLLADASaxFWL::SidTreeNode_*>_>
                ._M_impl.super__Vector_impl_data._M_finish;
    *pppSVar1 = *pppSVar1 + 1;
  }
  if (sid->_M_string_length != 0) {
    local_48.sid = &local_50->mSid;
    local_48.hierarchyLevel = 0;
    local_38.first.hierarchyLevel = 0;
    local_38.first.sid = local_48.sid;
    local_38.second = local_50;
    std::
    _Rb_tree<COLLADASaxFWL::SidTreeNode::SidIdentifier,std::pair<COLLADASaxFWL::SidTreeNode::SidIdentifier_const,COLLADASaxFWL::SidTreeNode*>,std::_Select1st<std::pair<COLLADASaxFWL::SidTreeNode::SidIdentifier_const,COLLADASaxFWL::SidTreeNode*>>,std::less<COLLADASaxFWL::SidTreeNode::SidIdentifier>,std::allocator<std::pair<COLLADASaxFWL::SidTreeNode::SidIdentifier_const,COLLADASaxFWL::SidTreeNode*>>>
    ::
    _M_emplace_unique<std::pair<COLLADASaxFWL::SidTreeNode::SidIdentifier,COLLADASaxFWL::SidTreeNode*>>
              ((_Rb_tree<COLLADASaxFWL::SidTreeNode::SidIdentifier,std::pair<COLLADASaxFWL::SidTreeNode::SidIdentifier_const,COLLADASaxFWL::SidTreeNode*>,std::_Select1st<std::pair<COLLADASaxFWL::SidTreeNode::SidIdentifier_const,COLLADASaxFWL::SidTreeNode*>>,std::less<COLLADASaxFWL::SidTreeNode::SidIdentifier>,std::allocator<std::pair<COLLADASaxFWL::SidTreeNode::SidIdentifier_const,COLLADASaxFWL::SidTreeNode*>>>
                *)&this->mChildren,&local_38);
    addChildToParents(this,local_50,&local_48);
  }
  return local_50;
}

Assistant:

SidTreeNode* SidTreeNode::createAndAddChild( const String& sid )
	{
		SidTreeNode* newChild = new SidTreeNode(sid, this);
		mDirectChildren.push_back(newChild);
		if ( !sid.empty() )
		{
			SidIdentifier newIdentifier(newChild->getSid(), 0);
			mChildren.insert(std::make_pair(newIdentifier, newChild));
			addChildToParents( newChild, newIdentifier );
		}
		return newChild;
	}